

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O3

int csp_eth_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort uVar1;
  void *pvVar2;
  undefined4 *addr;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  arp_list_entry_s *paVar6;
  ushort uVar7;
  
  if ((packet->id).dst == iface->addr) {
    csp_qfifo_write(packet,iface,(void *)0x0);
  }
  else {
    pvVar2 = iface->interface_data;
    csp_id_prepend(packet);
    csp_eth_tx::packet_id = csp_eth_tx::packet_id + 1;
    uVar1 = packet->frame_length;
    if (uVar1 != 0) {
      uVar7 = 0;
      do {
        uVar4 = *(short *)((long)pvVar2 + 0x62) - 0x16;
        uVar3 = uVar1 - uVar7;
        if (uVar4 <= (ushort)(uVar1 - uVar7)) {
          uVar3 = uVar4;
        }
        addr = *(undefined4 **)((long)pvVar2 + 0x70);
        *(undefined2 *)(addr + 3) = 0xb588;
        if (arp_list != (arp_list_entry_t *)0x0) {
          paVar6 = arp_list;
          do {
            if (paVar6->csp_addr == (packet->id).dst) {
              *(undefined2 *)(addr + 1) = *(undefined2 *)(paVar6->mac_addr + 4);
              *addr = *(undefined4 *)paVar6->mac_addr;
              goto LAB_0010e2e2;
            }
            paVar6 = paVar6->next;
          } while (paVar6 != (arp_list_entry_s *)0x0);
        }
        *(undefined2 *)(addr + 1) = 0xffff;
        *addr = 0xffffffff;
LAB_0010e2e2:
        *(undefined2 *)((long)addr + 10) = *(undefined2 *)((long)pvVar2 + 0x84);
        *(undefined4 *)((long)addr + 6) = *(undefined4 *)((long)pvVar2 + 0x80);
        uVar1 = packet->frame_length;
        uVar4 = (packet->id).src;
        *(uint16_t *)((long)addr + 0xe) = csp_eth_tx::packet_id << 8 | csp_eth_tx::packet_id >> 8;
        *(ushort *)(addr + 4) = uVar4 << 8 | uVar4 >> 8;
        *(ushort *)((long)addr + 0x12) = uVar3 << 8 | uVar3 >> 8;
        *(ushort *)(addr + 5) = uVar1 << 8 | uVar1 >> 8;
        memcpy((void *)((long)addr + 0x16),packet->frame_begin + (uint)uVar7,(ulong)uVar3);
        iVar5 = (**(code **)((long)pvVar2 + 0x68))(iface->driver_data,addr);
        if (iVar5 != 0) {
          iface->tx_error = iface->tx_error + 1;
          return -0xb;
        }
        if (eth_debug == true) {
          csp_hex_dump("tx",addr,uVar7 + 0x16 + (uint)uVar3);
        }
        uVar7 = uVar3 + uVar7;
        uVar1 = packet->frame_length;
      } while (uVar7 < uVar1);
    }
    csp_buffer_free(packet);
  }
  return 0;
}

Assistant:

int csp_eth_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    /* Loopback */
    if (packet->id.dst == iface->addr) {
        csp_qfifo_write(packet, iface, NULL);
        return CSP_ERR_NONE;
    }

    csp_id_prepend(packet);

    static uint16_t packet_id = 0;
    packet_id++;
    uint16_t offset = 0;

    while (offset < packet->frame_length) {

        csp_eth_header_t *eth_frame = ifdata->tx_buf;

        const uint16_t seg_size_max = ifdata->tx_mtu - sizeof(csp_eth_header_t);
        uint16_t seg_size = packet->frame_length - offset;
        if (seg_size > seg_size_max) {
            seg_size = seg_size_max;
        }

        eth_frame->ether_type = htobe16(CSP_ETH_TYPE_CSP);
        csp_eth_arp_get_addr(eth_frame->ether_dhost, packet->id.dst);
        memcpy(eth_frame->ether_shost, ifdata->if_mac, CSP_ETH_ALEN);

        csp_eth_pack_header(eth_frame, packet_id, packet->id.src, seg_size, packet->frame_length);

        memcpy(eth_frame->frame_begin, packet->frame_begin + offset, seg_size);

		if ((ifdata->tx_func)(iface->driver_data, eth_frame) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
        }

        if (eth_debug) csp_hex_dump("tx", eth_frame, sizeof(csp_eth_header_t) + offset + seg_size);

        offset += seg_size;
    }

    csp_buffer_free(packet);
    return CSP_ERR_NONE;
}